

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t split(linear_hash_table_t *linear_hash)

{
  char cVar1;
  FILE *pFVar2;
  ion_byte_t *piVar3;
  void *pvVar4;
  undefined8 bucket_loc;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ion_status_t iVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  void *__s;
  ion_fpos_t iVar13;
  ulong uVar14;
  undefined7 uVar15;
  undefined8 uStack_a0;
  char acStack_98 [8];
  ulong local_90;
  long local_88;
  ulong local_80;
  void *local_78;
  long local_70;
  long local_68;
  undefined1 local_60 [8];
  linear_hash_bucket_t bucket;
  int local_38;
  byte local_31;
  
  iVar13 = -1;
  if (linear_hash->next_split < linear_hash->bucket_map->current_size) {
    iVar13 = linear_hash->bucket_map->data[linear_hash->next_split];
  }
  uStack_a0 = 0x111fbc;
  iVar9.error = linear_hash_get_bucket(iVar13,(linear_hash_bucket_t *)local_60,linear_hash);
  iVar9._1_7_ = 0;
  if (iVar9.error == 0) {
    bucket.overflow_location =
         (ion_fpos_t)
         (acStack_98 + -((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    local_78 = (void *)(bucket.overflow_location +
                       -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0));
    sVar12 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = (void *)((long)local_78 - (sVar12 + 0xf & 0xfffffffffffffff0));
    *(undefined8 *)((long)__s + -8) = 0x112029;
    memset(__s,0,sVar12);
    local_68 = iVar13;
    uVar14 = 0;
    do {
      local_80 = uVar14;
      if (0 < (int)local_60._4_4_) {
        pFVar2 = (FILE *)linear_hash->database;
        lVar11 = local_68 + 0x10;
        local_88 = lVar11;
        *(undefined8 *)((long)__s + -8) = 0x112052;
        fseek(pFVar2,lVar11,0);
        iVar7 = linear_hash->records_per_bucket;
        sVar12 = linear_hash->record_total_size;
        pFVar2 = (FILE *)linear_hash->database;
        *(undefined8 *)((long)__s + -8) = 0x112067;
        fread(__s,sVar12,(long)iVar7,pFVar2);
        if (0 < (int)local_60._4_4_) {
          lVar11 = 0;
          local_38 = 0;
          do {
            iVar13 = bucket.overflow_location;
            cVar1 = *(char *)((long)__s + lVar11);
            sVar12 = (size_t)(linear_hash->super).record.key_size;
            local_70 = lVar11;
            *(undefined8 *)((long)__s + -8) = 0x1120a2;
            memcpy((void *)iVar13,(char *)((long)__s + lVar11) + 1,sVar12);
            pvVar4 = local_78;
            iVar7 = (linear_hash->super).record.value_size;
            *(undefined8 *)((long)__s + -8) = 0x1120b6;
            memcpy(pvVar4,(void *)((long)__s + sVar12 + lVar11 + 1),(long)iVar7);
            *(undefined8 *)((long)__s + -8) = 0x1120c1;
            uVar5 = insert_hash_to_bucket((ion_byte_t *)iVar13,linear_hash);
            uVar14 = (ulong)uVar5;
            *(undefined8 *)((long)__s + -8) = 0x1120cf;
            uVar6 = hash_to_bucket((ion_byte_t *)iVar13,linear_hash);
            iVar13 = bucket.overflow_location;
            if ((cVar1 == '\x01') && (uVar5 != uVar6)) {
              *(undefined8 *)((long)__s + -8) = 0x1120ee;
              iVar9 = linear_hash_delete((ion_byte_t *)iVar13,linear_hash);
              if (iVar9.error != '\0') goto LAB_00111fc0;
              linear_hash->last_cache_idx = 0;
              iVar7 = iVar9.count;
              uVar14 = (ulong)CONCAT31((int3)(uVar5 >> 8),iVar7 != 0 && -1 < (long)iVar9);
              if (iVar7 != 0 && -1 < (long)iVar9) {
                local_90 = (ulong)(uint)-iVar7;
                iVar10 = 1;
                do {
                  pvVar4 = local_78;
                  iVar8 = linear_hash->last_cache_idx;
                  sVar12 = (size_t)(linear_hash->super).record.value_size;
                  piVar3 = linear_hash->cache;
                  *(undefined8 *)((long)__s + -8) = 0x11214b;
                  memcpy(pvVar4,piVar3 + (long)iVar8 * sVar12,sVar12);
                  iVar13 = bucket.overflow_location;
                  linear_hash->last_cache_idx = iVar8 + 1;
                  *(undefined8 *)((long)__s + -8) = 0x112163;
                  iVar8 = hash_to_bucket((ion_byte_t *)iVar13,linear_hash);
                  *(undefined8 *)((long)__s + -8) = 0x112173;
                  iVar9 = linear_hash_insert((ion_key_t)iVar13,pvVar4,iVar8,linear_hash);
                  uVar15 = (undefined7)((ulong)pvVar4 >> 8);
                  if (iVar9.error != 0) {
                    uVar14 = CONCAT71(uVar15,(char)uVar14);
                    local_31 = iVar9.error;
                    goto LAB_001121f4;
                  }
                  uVar14 = CONCAT71(uVar15,iVar10 < iVar7);
                  iVar8 = (int)local_90 + iVar10;
                  iVar10 = iVar10 + 1;
                } while (iVar8 != 0);
              }
              lVar11 = local_88;
              pFVar2 = (FILE *)linear_hash->database;
              *(undefined8 *)((long)__s + -8) = 0x1121ae;
              fseek(pFVar2,lVar11,0);
              iVar7 = linear_hash->records_per_bucket;
              sVar12 = linear_hash->record_total_size;
              pFVar2 = (FILE *)linear_hash->database;
              *(undefined8 *)((long)__s + -8) = 0x1121c3;
              fread(__s,sVar12,(long)iVar7,pFVar2);
              lVar11 = local_68;
              *(undefined8 *)((long)__s + -8) = 0x1121d3;
              linear_hash_get_bucket(lVar11,(linear_hash_bucket_t *)local_60,linear_hash);
              local_70 = -linear_hash->record_total_size;
              local_38 = -1;
LAB_001121f4:
              iVar9._1_7_ = 0;
              iVar9.error = local_31;
              if ((uVar14 & 1) != 0) goto LAB_00111fc0;
            }
            lVar11 = local_70 + linear_hash->record_total_size;
            local_38 = local_38 + 1;
          } while (local_38 < (int)local_60._4_4_);
        }
      }
      bucket_loc = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        local_80 = CONCAT71((int7)(uVar14 >> 8),1);
      }
      else {
        *(undefined8 *)((long)__s + -8) = 0x112230;
        iVar9.error = linear_hash_get_bucket
                                (bucket_loc,(linear_hash_bucket_t *)local_60,linear_hash);
        iVar9._1_7_ = 0;
        local_68 = bucket_loc;
        if (iVar9.error != 0) goto LAB_00111fc0;
      }
      uVar14 = local_80;
    } while ((char)local_80 == '\0');
    linear_hash->next_split = linear_hash->next_split + 1;
    iVar9.error = '\0';
    iVar9._1_3_ = 0;
    iVar9.count = 0;
  }
LAB_00111fc0:
  return iVar9.error;
}

Assistant:

ion_err_t
split(
	linear_hash_table_t *linear_hash
) {
	/* status to hold amount of records deleted */
	ion_status_t status					= ION_STATUS_INITIALIZE;

	/* get bucket to split */
	ion_fpos_t				bucket_loc	= bucket_idx_to_ion_fpos_t(linear_hash->next_split, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status.error;
	}

	/* stores for record data */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int split_hash_key;
	int insert_hash_key;

	int			i, j;
	ion_byte_t	*records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false) {
		/* if the bucket is not empty */
		if (bucket.record_count > 0) {
			/* read all records into memory */
			fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
			fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

			/* scan records for records that should be placed in the new bucket */
			for (i = 0; i < bucket.record_count; i++) {
				memcpy(&record_status, records + record_offset, sizeof(record_status));
				memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
				memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

				insert_hash_key = insert_hash_to_bucket(record_key, linear_hash);

				split_hash_key	= hash_to_bucket(record_key, linear_hash);

				/* if the record is not a tombstone and h0(k) != h1(k) */
				if ((record_status == linear_hash_record_status_full) && (insert_hash_key != split_hash_key)) {
					/* delete all records with this key from the table */
					status = linear_hash_delete(record_key, linear_hash);

					if (status.error != err_ok) {
						return status.error;
					}

					int num_deleted = status.count;

					linear_hash->last_cache_idx = 0;

					/* insert that many records into the table */
					for (j = 0; j < num_deleted; j++) {
						memcpy(record_value, linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						status = linear_hash_insert(record_key, record_value, hash_to_bucket(record_key, linear_hash), linear_hash);

						if (status.error != err_ok) {
							return status.error;
						}
					}

					/* refresh cached data and restart iteration and offset tracker */
					fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
					fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);
					status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
					i				= -1;
					record_offset	= -1 * linear_hash->record_total_size;
				}

				/* track offset from locations of records in memory the next record is at */
				record_offset += linear_hash->record_total_size;
			}

			/* reset offset */
			record_offset = 0;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status.error;
			}
		}
	}

	return linear_hash_increment_next_split(linear_hash);
}